

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commander.cpp
# Opt level: O1

Command * __thiscall Commander::getCommand(Commander *this,string *line)

{
  pointer pcVar1;
  iterator iVar2;
  mapped_type *ppCVar3;
  mapped_type pCVar4;
  string name;
  key_type local_40;
  
  pcVar1 = (line->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + line->_M_string_length);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
          ::find(&(this->cmds)._M_t,&local_40);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->cmds)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"No such command",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    pCVar4 = (mapped_type)0x0;
  }
  else {
    ppCVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
              ::operator[](&this->cmds,&local_40);
    pCVar4 = *ppCVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pCVar4;
}

Assistant:

Command* Commander::getCommand(const std::string& line)
{
    std::string name = line;
    //TODO: split the line...
    if (cmds.find(name) == cmds.end() ) {
       std::cerr << "No such command" << endl;
       return NULL;
    }

    Command *cmd = this->cmds[name];
    return cmd;
}